

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::ColumnMetaData::read(ColumnMetaData *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint32_t uVar9;
  int iVar10;
  uint uVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  ssize_t sVar15;
  undefined8 uVar16;
  void *__buf_00;
  undefined4 in_register_00000034;
  uint32_t _i119;
  TType _etype118;
  uint32_t _size115;
  uint32_t _i114;
  TType _etype113;
  uint32_t _size110;
  int32_t ecast109;
  uint32_t _i108;
  TType _etype107;
  uint32_t _size104;
  int32_t ecast103;
  uint32_t _i102;
  TType _etype101;
  uint32_t _size98;
  int32_t ecast97;
  bool isset_data_page_offset;
  bool isset_total_compressed_size;
  bool isset_total_uncompressed_size;
  bool isset_num_values;
  bool isset_codec;
  bool isset_path_in_schema;
  bool isset_encodings;
  bool isset_type;
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  undefined4 in_stack_fffffffffffffe18;
  TProtocolExceptionType in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  string *in_stack_fffffffffffffe28;
  TProtocol *in_stack_fffffffffffffe30;
  size_type in_stack_fffffffffffffe38;
  vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
  *in_stack_fffffffffffffe40;
  uint local_98;
  uint local_90;
  uint local_8c;
  uint local_84;
  type local_80;
  uint local_7c;
  uint local_74;
  value_type local_70;
  uint local_6c;
  uint local_64;
  type local_60;
  undefined2 local_46;
  int local_44;
  string local_40 [36];
  uint local_1c;
  undefined8 local_10;
  ColumnMetaData *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  duckdb_apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
             ,(TProtocol *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  uVar9 = duckdb_apache::thrift::protocol::TProtocol::readStructBegin
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (string *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  local_1c = uVar9 + local_1c;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  bVar5 = false;
  bVar6 = false;
  bVar7 = false;
  bVar8 = false;
  while( true ) {
    uVar9 = duckdb_apache::thrift::protocol::TProtocol::readFieldBegin
                      (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                       (TType *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (int16_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    local_1c = uVar9 + local_1c;
    if (local_44 == 0) break;
    switch(local_46) {
    case 1:
      if (local_44 == 8) {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (int32_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
        ;
        local_1c = uVar9 + local_1c;
        this->type = local_60;
        bVar1 = true;
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 2:
      if (local_44 == 0xf) {
        duckdb::vector<duckdb_parquet::Encoding::type,_true>::clear
                  ((vector<duckdb_parquet::Encoding::type,_true> *)0x2252510);
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readListBegin
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (TType *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                           (uint32_t *)0x225252d);
        local_1c = local_1c + uVar9;
        std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
        ::resize(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        for (local_6c = 0; local_6c < local_64; local_6c = local_6c + 1) {
          uVar9 = duckdb_apache::thrift::protocol::TProtocol::readI32
                            ((TProtocol *)
                             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                             (int32_t *)
                             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          local_1c = local_1c + uVar9;
          pvVar12 = duckdb::vector<duckdb_parquet::Encoding::type,_true>::operator[]
                              ((vector<duckdb_parquet::Encoding::type,_true> *)
                               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          *pvVar12 = local_70;
        }
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readListEnd((TProtocol *)0x2252623);
        local_1c = uVar9 + local_1c;
        bVar2 = true;
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 3:
      if (local_44 == 0xf) {
        duckdb::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)0x22526a1);
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readListBegin
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (TType *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                           (uint32_t *)0x22526be);
        local_1c = local_1c + uVar9;
        duckdb::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        for (local_7c = 0; local_7c < local_74; local_7c = local_7c + 1) {
          duckdb::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          uVar9 = duckdb_apache::thrift::protocol::TProtocol::readString
                            ((TProtocol *)
                             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                             (string *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)
                            );
          local_1c = uVar9 + local_1c;
        }
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readListEnd((TProtocol *)0x225279f);
        local_1c = uVar9 + local_1c;
        bVar3 = true;
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 4:
      if (local_44 == 8) {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (int32_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
        ;
        local_1c = uVar9 + local_1c;
        this->codec = local_80;
        bVar4 = true;
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 5:
      if (local_44 == 10) {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readI64
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (int64_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
        ;
        local_1c = uVar9 + local_1c;
        bVar5 = true;
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 6:
      if (local_44 == 10) {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readI64
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (int64_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
        ;
        local_1c = uVar9 + local_1c;
        bVar6 = true;
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 7:
      if (local_44 == 10) {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readI64
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (int64_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
        ;
        local_1c = uVar9 + local_1c;
        bVar7 = true;
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 8:
      if (local_44 == 0xf) {
        duckdb::vector<duckdb_parquet::KeyValue,_true>::clear
                  ((vector<duckdb_parquet::KeyValue,_true> *)0x2252a33);
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readListBegin
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (TType *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                           (uint32_t *)0x2252a50);
        local_1c = local_1c + uVar9;
        std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::resize
                  ((vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_> *)
                   in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        for (local_8c = 0; local_8c < local_84; local_8c = local_8c + 1) {
          pvVar13 = duckdb::vector<duckdb_parquet::KeyValue,_true>::operator[]
                              ((vector<duckdb_parquet::KeyValue,_true> *)
                               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          iVar10 = (**(code **)(*(long *)pvVar13 + 0x10))(pvVar13,local_10);
          local_1c = iVar10 + local_1c;
        }
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readListEnd((TProtocol *)0x2252b22);
        local_1c = uVar9 + local_1c;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset & 0xfe | 1);
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 9:
      if (local_44 == 10) {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readI64
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (int64_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
        ;
        local_1c = uVar9 + local_1c;
        bVar8 = true;
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 10:
      if (local_44 == 10) {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readI64
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (int64_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
        ;
        local_1c = uVar9 + local_1c;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset & 0xfd | 2);
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 0xb:
      if (local_44 == 10) {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readI64
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (int64_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
        ;
        local_1c = uVar9 + local_1c;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset & 0xfb | 4);
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 0xc:
      if (local_44 == 0xc) {
        sVar15 = Statistics::read(&this->statistics,(int)local_10,__buf_00,0x2ae7620);
        local_1c = (int)sVar15 + local_1c;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset & 0xf7 | 8);
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 0xd:
      if (local_44 == 0xf) {
        duckdb::vector<duckdb_parquet::PageEncodingStats,_true>::clear
                  ((vector<duckdb_parquet::PageEncodingStats,_true> *)0x2252df9);
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readListBegin
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (TType *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                           (uint32_t *)0x2252e16);
        local_1c = local_1c + uVar9;
        std::
        vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
        ::resize((vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
                  *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        for (local_98 = 0; local_98 < local_90; local_98 = local_98 + 1) {
          pvVar14 = duckdb::vector<duckdb_parquet::PageEncodingStats,_true>::operator[]
                              ((vector<duckdb_parquet::PageEncodingStats,_true> *)
                               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          iVar10 = (**(code **)(*(long *)pvVar14 + 0x10))(pvVar14,local_10);
          local_1c = iVar10 + local_1c;
        }
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readListEnd((TProtocol *)0x2252ee8);
        local_1c = uVar9 + local_1c;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset & 0xef | 0x10);
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 0xe:
      if (local_44 == 10) {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readI64
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (int64_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
        ;
        local_1c = uVar9 + local_1c;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset & 0xdf | 0x20);
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 0xf:
      if (local_44 == 8) {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (int32_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
        ;
        local_1c = uVar9 + local_1c;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset & 0xbf | 0x40);
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    case 0x10:
      if (local_44 == 0xc) {
        sVar15 = SizeStatistics::read(&this->size_statistics,(int)local_10,__buf_00,0x2ae7620);
        local_1c = (int)sVar15 + local_1c;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset & 0x7f | 0x80);
      }
      else {
        uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
        local_1c = uVar9 + local_1c;
      }
      break;
    default:
      uVar9 = duckdb_apache::thrift::protocol::TProtocol::skip
                        ((TProtocol *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                         in_stack_fffffffffffffe1c);
      local_1c = uVar9 + local_1c;
    }
    uVar9 = duckdb_apache::thrift::protocol::TProtocol::readFieldEnd((TProtocol *)0x2253124);
    local_1c = uVar9 + local_1c;
  }
  uVar9 = duckdb_apache::thrift::protocol::TProtocol::readStructEnd((TProtocol *)0x225314e);
  uVar11 = uVar9 + local_1c;
  local_1c = uVar11;
  if (!bVar1) {
    uVar16 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              ((TProtocolException *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe1c);
    __cxa_throw(uVar16,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if (!bVar2) {
    uVar16 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              ((TProtocolException *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe1c);
    __cxa_throw(uVar16,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if (!bVar3) {
    uVar16 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              ((TProtocolException *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe1c);
    __cxa_throw(uVar16,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if (!bVar4) {
    uVar16 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              ((TProtocolException *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe1c);
    __cxa_throw(uVar16,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if (!bVar5) {
    uVar16 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              ((TProtocolException *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe1c);
    __cxa_throw(uVar16,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if (!bVar6) {
    uVar16 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              ((TProtocolException *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe1c);
    __cxa_throw(uVar16,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if (bVar7) {
    if (bVar8) {
      std::__cxx11::string::~string(local_40);
      duckdb_apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
                ((TInputRecursionTracker *)0x22534dd);
      return (ulong)uVar11;
    }
    uVar16 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              ((TProtocolException *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe1c);
    __cxa_throw(uVar16,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  uVar16 = __cxa_allocate_exception(0x30);
  duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
            ((TProtocolException *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe1c);
  __cxa_throw(uVar16,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
              duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
}

Assistant:

uint32_t ColumnMetaData::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_type = false;
  bool isset_encodings = false;
  bool isset_path_in_schema = false;
  bool isset_codec = false;
  bool isset_num_values = false;
  bool isset_total_uncompressed_size = false;
  bool isset_total_compressed_size = false;
  bool isset_data_page_offset = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast97;
          xfer += iprot->readI32(ecast97);
          this->type = static_cast<Type::type>(ecast97);
          isset_type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->encodings.clear();
            uint32_t _size98;
            ::apache::thrift::protocol::TType _etype101;
            xfer += iprot->readListBegin(_etype101, _size98);
            this->encodings.resize(_size98);
            uint32_t _i102;
            for (_i102 = 0; _i102 < _size98; ++_i102)
            {
              int32_t ecast103;
              xfer += iprot->readI32(ecast103);
              this->encodings[_i102] = static_cast<Encoding::type>(ecast103);
            }
            xfer += iprot->readListEnd();
          }
          isset_encodings = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->path_in_schema.clear();
            uint32_t _size104;
            ::apache::thrift::protocol::TType _etype107;
            xfer += iprot->readListBegin(_etype107, _size104);
            this->path_in_schema.resize(_size104);
            uint32_t _i108;
            for (_i108 = 0; _i108 < _size104; ++_i108)
            {
              xfer += iprot->readString(this->path_in_schema[_i108]);
            }
            xfer += iprot->readListEnd();
          }
          isset_path_in_schema = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast109;
          xfer += iprot->readI32(ecast109);
          this->codec = static_cast<CompressionCodec::type>(ecast109);
          isset_codec = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->num_values);
          isset_num_values = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->total_uncompressed_size);
          isset_total_uncompressed_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->total_compressed_size);
          isset_total_compressed_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->key_value_metadata.clear();
            uint32_t _size110;
            ::apache::thrift::protocol::TType _etype113;
            xfer += iprot->readListBegin(_etype113, _size110);
            this->key_value_metadata.resize(_size110);
            uint32_t _i114;
            for (_i114 = 0; _i114 < _size110; ++_i114)
            {
              xfer += this->key_value_metadata[_i114].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.key_value_metadata = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 9:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->data_page_offset);
          isset_data_page_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 10:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->index_page_offset);
          this->__isset.index_page_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 11:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->dictionary_page_offset);
          this->__isset.dictionary_page_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 12:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->statistics.read(iprot);
          this->__isset.statistics = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 13:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->encoding_stats.clear();
            uint32_t _size115;
            ::apache::thrift::protocol::TType _etype118;
            xfer += iprot->readListBegin(_etype118, _size115);
            this->encoding_stats.resize(_size115);
            uint32_t _i119;
            for (_i119 = 0; _i119 < _size115; ++_i119)
            {
              xfer += this->encoding_stats[_i119].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.encoding_stats = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 14:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->bloom_filter_offset);
          this->__isset.bloom_filter_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 15:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->bloom_filter_length);
          this->__isset.bloom_filter_length = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 16:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->size_statistics.read(iprot);
          this->__isset.size_statistics = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_type)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_encodings)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_path_in_schema)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_codec)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_num_values)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_total_uncompressed_size)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_total_compressed_size)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_data_page_offset)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}